

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O1

int md5_compress(hash_state *md,uchar *buf)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong32 uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  
  iVar1 = *(int *)(buf + 0xc);
  iVar2 = *(int *)(buf + 8);
  iVar3 = *(int *)buf;
  iVar4 = *(int *)(buf + 4);
  uVar5 = (md->sha1).state[1];
  uVar6 = (md->sha1).state[2];
  uVar7 = (md->sha1).state[3];
  uVar21 = (md->sha1).state[0] + iVar3 + ((uVar7 ^ uVar6) & uVar5 ^ uVar7) + 0xd76aa478;
  uVar21 = (uVar21 * 0x80 | uVar21 >> 0x19) + uVar5;
  uVar22 = uVar7 + iVar4 + ((uVar6 ^ uVar5) & uVar21 ^ uVar6) + 0xe8c7b756;
  uVar22 = (uVar22 * 0x1000 | uVar22 >> 0x14) + uVar21;
  uVar23 = ((uVar21 ^ uVar5) & uVar22 ^ uVar5) + uVar6 + iVar2 + 0x242070db;
  uVar23 = (uVar23 * 0x20000 | uVar23 >> 0xf) + uVar22;
  uVar24 = ((uVar22 ^ uVar21) & uVar23 ^ uVar21) + uVar5 + iVar1 + 0xc1bdceee;
  uVar24 = (uVar24 * 0x400000 | uVar24 >> 10) + uVar23;
  iVar8 = *(int *)(buf + 0x10);
  uVar21 = uVar21 + iVar8 + ((uVar23 ^ uVar22) & uVar24 ^ uVar22) + 0xf57c0faf;
  uVar21 = (uVar21 * 0x80 | uVar21 >> 0x19) + uVar24;
  iVar9 = *(int *)(buf + 0x14);
  uVar22 = uVar22 + iVar9 + ((uVar24 ^ uVar23) & uVar21 ^ uVar23) + 0x4787c62a;
  uVar22 = (uVar22 * 0x1000 | uVar22 >> 0x14) + uVar21;
  iVar10 = *(int *)(buf + 0x18);
  uVar23 = ((uVar21 ^ uVar24) & uVar22 ^ uVar24) + uVar23 + iVar10 + 0xa8304613;
  uVar25 = (uVar23 * 0x20000 | uVar23 >> 0xf) + uVar22;
  iVar11 = *(int *)(buf + 0x1c);
  uVar23 = uVar24 + iVar11 + ((uVar22 ^ uVar21) & uVar25 ^ uVar21) + 0xfd469501;
  uVar24 = (uVar23 * 0x400000 | uVar23 >> 10) + uVar25;
  iVar12 = *(int *)(buf + 0x20);
  uVar21 = uVar21 + iVar12 + ((uVar25 ^ uVar22) & uVar24 ^ uVar22) + 0x698098d8;
  uVar21 = (uVar21 * 0x80 | uVar21 >> 0x19) + uVar24;
  iVar13 = *(int *)(buf + 0x24);
  uVar22 = ((uVar24 ^ uVar25) & uVar21 ^ uVar25) + uVar22 + iVar13 + 0x8b44f7af;
  uVar23 = (uVar22 * 0x1000 | uVar22 >> 0x14) + uVar21;
  iVar14 = *(int *)(buf + 0x28);
  uVar22 = (uVar25 + iVar14 + ((uVar21 ^ uVar24) & uVar23 ^ uVar24)) - 0xa44f;
  uVar26 = (uVar22 * 0x20000 | uVar22 >> 0xf) + uVar23;
  iVar15 = *(int *)(buf + 0x2c);
  uVar22 = ((uVar23 ^ uVar21) & uVar26 ^ uVar21) + uVar24 + iVar15 + 0x895cd7be;
  uVar22 = (uVar22 * 0x400000 | uVar22 >> 10) + uVar26;
  iVar16 = *(int *)(buf + 0x30);
  uVar21 = ((uVar26 ^ uVar23) & uVar22 ^ uVar23) + uVar21 + iVar16 + 0x6b901122;
  uVar25 = (uVar21 * 0x80 | uVar21 >> 0x19) + uVar22;
  iVar17 = *(int *)(buf + 0x34);
  uVar21 = uVar23 + iVar17 + ((uVar22 ^ uVar26) & uVar25 ^ uVar26) + 0xfd987193;
  uVar24 = (uVar21 * 0x1000 | uVar21 >> 0x14) + uVar25;
  iVar18 = *(int *)(buf + 0x38);
  uVar21 = ((uVar25 ^ uVar22) & uVar24 ^ uVar22) + uVar26 + iVar18 + 0xa679438e;
  iVar19 = *(int *)(buf + 0x3c);
  uVar23 = (uVar21 * 0x20000 | uVar21 >> 0xf) + uVar24;
  uVar21 = uVar22 + iVar19 + ((uVar24 ^ uVar25) & uVar23 ^ uVar25) + 0x49b40821;
  uVar21 = (uVar21 * 0x400000 | uVar21 >> 10) + uVar23;
  uVar22 = ((uVar21 ^ uVar23) & uVar24 ^ uVar23) + uVar25 + iVar4 + 0xf61e2562;
  uVar26 = (uVar22 * 0x20 | uVar22 >> 0x1b) + uVar21;
  uVar22 = uVar24 + iVar10 + ((uVar26 ^ uVar21) & uVar23 ^ uVar21) + 0xc040b340;
  uVar24 = (uVar22 * 0x200 | uVar22 >> 0x17) + uVar26;
  uVar22 = uVar23 + iVar15 + ((uVar24 ^ uVar26) & uVar21 ^ uVar26) + 0x265e5a51;
  uVar22 = (uVar22 * 0x4000 | uVar22 >> 0x12) + uVar24;
  uVar21 = ((uVar22 ^ uVar24) & uVar26 ^ uVar24) + uVar21 + iVar3 + 0xe9b6c7aa;
  uVar25 = (uVar21 * 0x100000 | uVar21 >> 0xc) + uVar22;
  uVar21 = uVar26 + iVar9 + ((uVar25 ^ uVar22) & uVar24 ^ uVar22) + 0xd62f105d;
  uVar26 = (uVar21 * 0x20 | uVar21 >> 0x1b) + uVar25;
  uVar21 = uVar24 + iVar14 + ((uVar26 ^ uVar25) & uVar22 ^ uVar25) + 0x2441453;
  uVar23 = (uVar21 * 0x200 | uVar21 >> 0x17) + uVar26;
  uVar21 = uVar22 + iVar19 + ((uVar23 ^ uVar26) & uVar25 ^ uVar26) + 0xd8a1e681;
  uVar21 = (uVar21 * 0x4000 | uVar21 >> 0x12) + uVar23;
  uVar22 = uVar25 + iVar8 + ((uVar21 ^ uVar23) & uVar26 ^ uVar23) + 0xe7d3fbc8;
  uVar24 = (uVar22 * 0x100000 | uVar22 >> 0xc) + uVar21;
  uVar22 = uVar26 + iVar13 + ((uVar24 ^ uVar21) & uVar23 ^ uVar21) + 0x21e1cde6;
  uVar25 = (uVar22 * 0x20 | uVar22 >> 0x1b) + uVar24;
  uVar22 = uVar23 + iVar18 + ((uVar25 ^ uVar24) & uVar21 ^ uVar24) + 0xc33707d6;
  uVar22 = (uVar22 * 0x200 | uVar22 >> 0x17) + uVar25;
  uVar21 = uVar21 + iVar1 + ((uVar22 ^ uVar25) & uVar24 ^ uVar25) + 0xf4d50d87;
  uVar21 = (uVar21 * 0x4000 | uVar21 >> 0x12) + uVar22;
  uVar23 = uVar24 + iVar12 + ((uVar21 ^ uVar22) & uVar25 ^ uVar22) + 0x455a14ed;
  uVar24 = (uVar23 * 0x100000 | uVar23 >> 0xc) + uVar21;
  uVar23 = uVar25 + iVar17 + ((uVar24 ^ uVar21) & uVar22 ^ uVar21) + 0xa9e3e905;
  uVar25 = (uVar23 * 0x20 | uVar23 >> 0x1b) + uVar24;
  uVar22 = uVar22 + iVar2 + ((uVar25 ^ uVar24) & uVar21 ^ uVar24) + 0xfcefa3f8;
  uVar23 = (uVar22 * 0x200 | uVar22 >> 0x17) + uVar25;
  uVar21 = ((uVar23 ^ uVar25) & uVar24 ^ uVar25) + uVar21 + iVar11 + 0x676f02d9;
  uVar21 = (uVar21 * 0x4000 | uVar21 >> 0x12) + uVar23;
  uVar22 = uVar24 + iVar16 + ((uVar21 ^ uVar23) & uVar25 ^ uVar23) + 0x8d2a4c8a;
  uVar24 = (uVar22 * 0x100000 | uVar22 >> 0xc) + uVar21;
  uVar22 = ((uVar21 ^ uVar23 ^ uVar24) + uVar25 + iVar9) - 0x5c6be;
  uVar22 = (uVar22 * 0x10 | uVar22 >> 0x1c) + uVar24;
  uVar23 = (uVar24 ^ uVar21 ^ uVar22) + uVar23 + iVar12 + 0x8771f681;
  uVar25 = (uVar23 * 0x800 | uVar23 >> 0x15) + uVar22;
  uVar21 = (uVar22 ^ uVar24 ^ uVar25) + uVar21 + iVar15 + 0x6d9d6122;
  uVar23 = (uVar21 * 0x10000 | uVar21 >> 0x10) + uVar25;
  uVar21 = uVar24 + iVar18 + (uVar25 ^ uVar22 ^ uVar23) + 0xfde5380c;
  uVar24 = (uVar21 * 0x800000 | uVar21 >> 9) + uVar23;
  uVar21 = uVar22 + iVar4 + (uVar23 ^ uVar25 ^ uVar24) + 0xa4beea44;
  uVar21 = (uVar21 * 0x10 | uVar21 >> 0x1c) + uVar24;
  uVar22 = uVar25 + iVar8 + (uVar24 ^ uVar23 ^ uVar21) + 0x4bdecfa9;
  uVar25 = (uVar22 * 0x800 | uVar22 >> 0x15) + uVar21;
  uVar22 = uVar23 + iVar11 + (uVar21 ^ uVar24 ^ uVar25) + 0xf6bb4b60;
  uVar23 = (uVar22 * 0x10000 | uVar22 >> 0x10) + uVar25;
  uVar22 = uVar24 + iVar14 + (uVar25 ^ uVar21 ^ uVar23) + 0xbebfbc70;
  uVar24 = (uVar22 * 0x800000 | uVar22 >> 9) + uVar23;
  uVar21 = uVar21 + iVar17 + (uVar23 ^ uVar25 ^ uVar24) + 0x289b7ec6;
  uVar22 = (uVar21 * 0x10 | uVar21 >> 0x1c) + uVar24;
  uVar21 = uVar25 + iVar3 + (uVar24 ^ uVar23 ^ uVar22) + 0xeaa127fa;
  uVar26 = (uVar21 * 0x800 | uVar21 >> 0x15) + uVar22;
  uVar21 = (uVar22 ^ uVar24 ^ uVar26) + uVar23 + iVar1 + 0xd4ef3085;
  uVar21 = (uVar21 * 0x10000 | uVar21 >> 0x10) + uVar26;
  uVar23 = uVar24 + iVar10 + (uVar26 ^ uVar22 ^ uVar21) + 0x4881d05;
  uVar25 = (uVar23 * 0x800000 | uVar23 >> 9) + uVar21;
  uVar22 = uVar22 + iVar13 + (uVar21 ^ uVar26 ^ uVar25) + 0xd9d4d039;
  uVar22 = (uVar22 * 0x10 | uVar22 >> 0x1c) + uVar25;
  uVar23 = (uVar25 ^ uVar21 ^ uVar22) + uVar26 + iVar16 + 0xe6db99e5;
  uVar23 = (uVar23 * 0x800 | uVar23 >> 0x15) + uVar22;
  uVar21 = uVar21 + iVar19 + (uVar22 ^ uVar25 ^ uVar23) + 0x1fa27cf8;
  uVar24 = (uVar21 * 0x10000 | uVar21 >> 0x10) + uVar23;
  uVar21 = (uVar23 ^ uVar22 ^ uVar24) + uVar25 + iVar2 + 0xc4ac5665;
  uVar25 = (uVar21 * 0x800000 | uVar21 >> 9) + uVar24;
  uVar21 = ((~uVar23 | uVar25) ^ uVar24) + uVar22 + iVar3 + 0xf4292244;
  uVar21 = (uVar21 * 0x40 | uVar21 >> 0x1a) + uVar25;
  uVar22 = ((~uVar24 | uVar21) ^ uVar25) + uVar23 + iVar11 + 0x432aff97;
  uVar23 = (uVar22 * 0x400 | uVar22 >> 0x16) + uVar21;
  uVar22 = ((~uVar25 | uVar23) ^ uVar21) + uVar24 + iVar18 + 0xab9423a7;
  uVar22 = (uVar22 * 0x8000 | uVar22 >> 0x11) + uVar23;
  uVar24 = ((~uVar21 | uVar22) ^ uVar23) + uVar25 + iVar9 + 0xfc93a039;
  uVar24 = (uVar24 * 0x200000 | uVar24 >> 0xb) + uVar22;
  uVar21 = uVar21 + iVar16 + ((~uVar23 | uVar24) ^ uVar22) + 0x655b59c3;
  uVar21 = (uVar21 * 0x40 | uVar21 >> 0x1a) + uVar24;
  uVar23 = uVar23 + iVar1 + ((~uVar22 | uVar21) ^ uVar24) + 0x8f0ccc92;
  uVar23 = (uVar23 * 0x400 | uVar23 >> 0x16) + uVar21;
  uVar22 = (uVar22 + iVar14 + ((~uVar24 | uVar23) ^ uVar21)) - 0x100b83;
  uVar22 = (uVar22 * 0x8000 | uVar22 >> 0x11) + uVar23;
  uVar24 = uVar24 + iVar4 + ((~uVar21 | uVar22) ^ uVar23) + 0x85845dd1;
  uVar24 = (uVar24 * 0x200000 | uVar24 >> 0xb) + uVar22;
  uVar21 = uVar21 + iVar12 + ((~uVar23 | uVar24) ^ uVar22) + 0x6fa87e4f;
  uVar21 = (uVar21 * 0x40 | uVar21 >> 0x1a) + uVar24;
  uVar23 = ((~uVar22 | uVar21) ^ uVar24) + uVar23 + iVar19 + 0xfe2ce6e0;
  uVar23 = (uVar23 * 0x400 | uVar23 >> 0x16) + uVar21;
  uVar22 = uVar22 + iVar10 + ((~uVar24 | uVar23) ^ uVar21) + 0xa3014314;
  uVar22 = (uVar22 * 0x8000 | uVar22 >> 0x11) + uVar23;
  uVar24 = ((~uVar21 | uVar22) ^ uVar23) + uVar24 + iVar17 + 0x4e0811a1;
  uVar24 = (uVar24 * 0x200000 | uVar24 >> 0xb) + uVar22;
  uVar21 = uVar21 + iVar8 + ((~uVar23 | uVar24) ^ uVar22) + 0xf7537e82;
  uVar21 = (uVar21 * 0x40 | uVar21 >> 0x1a) + uVar24;
  uVar23 = uVar23 + iVar15 + ((~uVar22 | uVar21) ^ uVar24) + 0xbd3af235;
  uVar23 = (uVar23 * 0x400 | uVar23 >> 0x16) + uVar21;
  uVar22 = uVar22 + iVar2 + ((~uVar24 | uVar23) ^ uVar21) + 0x2ad7d2bb;
  uVar22 = (uVar22 * 0x8000 | uVar22 >> 0x11) + uVar23;
  uVar24 = uVar24 + iVar13 + ((~uVar21 | uVar22) ^ uVar23) + 0xeb86d391;
  (md->sha1).state[0] = uVar21 + (md->sha1).state[0];
  uVar20 = uVar5 + uVar22 + (uVar24 * 0x200000 | uVar24 >> 0xb);
  (md->sha1).state[1] = uVar20;
  (md->sha1).state[2] = uVar22 + uVar6;
  (md->sha1).state[3] = uVar23 + uVar7;
  return uVar20;
}

Assistant:

static int  md5_compress(hash_state *md, unsigned char *buf)
#endif
{
    ulong32 i, W[16], a, b, c, d;
#ifdef LTC_SMALL_CODE
    ulong32 t;
#endif

    /* copy the state into 512-bits into W[0..15] */
    for (i = 0; i < 16; i++) {
        LOAD32L(W[i], buf + (4*i));
    }

    /* copy state */
    a = md->md5.state[0];
    b = md->md5.state[1];
    c = md->md5.state[2];
    d = md->md5.state[3];

#ifdef LTC_SMALL_CODE
    for (i = 0; i < 16; ++i) {
        FF(a,b,c,d,W[Worder[i]],Rorder[i],Korder[i]);
        t = d; d = c; c = b; b = a; a = t;
    }

    for (; i < 32; ++i) {
        GG(a,b,c,d,W[Worder[i]],Rorder[i],Korder[i]);
        t = d; d = c; c = b; b = a; a = t;
    }

    for (; i < 48; ++i) {
        HH(a,b,c,d,W[Worder[i]],Rorder[i],Korder[i]);
        t = d; d = c; c = b; b = a; a = t;
    }

    for (; i < 64; ++i) {
        II(a,b,c,d,W[Worder[i]],Rorder[i],Korder[i]);
        t = d; d = c; c = b; b = a; a = t;
    }

#else
    FF(a,b,c,d,W[0],7,0xd76aa478UL)
    FF(d,a,b,c,W[1],12,0xe8c7b756UL)
    FF(c,d,a,b,W[2],17,0x242070dbUL)
    FF(b,c,d,a,W[3],22,0xc1bdceeeUL)
    FF(a,b,c,d,W[4],7,0xf57c0fafUL)
    FF(d,a,b,c,W[5],12,0x4787c62aUL)
    FF(c,d,a,b,W[6],17,0xa8304613UL)
    FF(b,c,d,a,W[7],22,0xfd469501UL)
    FF(a,b,c,d,W[8],7,0x698098d8UL)
    FF(d,a,b,c,W[9],12,0x8b44f7afUL)
    FF(c,d,a,b,W[10],17,0xffff5bb1UL)
    FF(b,c,d,a,W[11],22,0x895cd7beUL)
    FF(a,b,c,d,W[12],7,0x6b901122UL)
    FF(d,a,b,c,W[13],12,0xfd987193UL)
    FF(c,d,a,b,W[14],17,0xa679438eUL)
    FF(b,c,d,a,W[15],22,0x49b40821UL)
    GG(a,b,c,d,W[1],5,0xf61e2562UL)
    GG(d,a,b,c,W[6],9,0xc040b340UL)
    GG(c,d,a,b,W[11],14,0x265e5a51UL)
    GG(b,c,d,a,W[0],20,0xe9b6c7aaUL)
    GG(a,b,c,d,W[5],5,0xd62f105dUL)
    GG(d,a,b,c,W[10],9,0x02441453UL)
    GG(c,d,a,b,W[15],14,0xd8a1e681UL)
    GG(b,c,d,a,W[4],20,0xe7d3fbc8UL)
    GG(a,b,c,d,W[9],5,0x21e1cde6UL)
    GG(d,a,b,c,W[14],9,0xc33707d6UL)
    GG(c,d,a,b,W[3],14,0xf4d50d87UL)
    GG(b,c,d,a,W[8],20,0x455a14edUL)
    GG(a,b,c,d,W[13],5,0xa9e3e905UL)
    GG(d,a,b,c,W[2],9,0xfcefa3f8UL)
    GG(c,d,a,b,W[7],14,0x676f02d9UL)
    GG(b,c,d,a,W[12],20,0x8d2a4c8aUL)
    HH(a,b,c,d,W[5],4,0xfffa3942UL)
    HH(d,a,b,c,W[8],11,0x8771f681UL)
    HH(c,d,a,b,W[11],16,0x6d9d6122UL)
    HH(b,c,d,a,W[14],23,0xfde5380cUL)
    HH(a,b,c,d,W[1],4,0xa4beea44UL)
    HH(d,a,b,c,W[4],11,0x4bdecfa9UL)
    HH(c,d,a,b,W[7],16,0xf6bb4b60UL)
    HH(b,c,d,a,W[10],23,0xbebfbc70UL)
    HH(a,b,c,d,W[13],4,0x289b7ec6UL)
    HH(d,a,b,c,W[0],11,0xeaa127faUL)
    HH(c,d,a,b,W[3],16,0xd4ef3085UL)
    HH(b,c,d,a,W[6],23,0x04881d05UL)
    HH(a,b,c,d,W[9],4,0xd9d4d039UL)
    HH(d,a,b,c,W[12],11,0xe6db99e5UL)
    HH(c,d,a,b,W[15],16,0x1fa27cf8UL)
    HH(b,c,d,a,W[2],23,0xc4ac5665UL)
    II(a,b,c,d,W[0],6,0xf4292244UL)
    II(d,a,b,c,W[7],10,0x432aff97UL)
    II(c,d,a,b,W[14],15,0xab9423a7UL)
    II(b,c,d,a,W[5],21,0xfc93a039UL)
    II(a,b,c,d,W[12],6,0x655b59c3UL)
    II(d,a,b,c,W[3],10,0x8f0ccc92UL)
    II(c,d,a,b,W[10],15,0xffeff47dUL)
    II(b,c,d,a,W[1],21,0x85845dd1UL)
    II(a,b,c,d,W[8],6,0x6fa87e4fUL)
    II(d,a,b,c,W[15],10,0xfe2ce6e0UL)
    II(c,d,a,b,W[6],15,0xa3014314UL)
    II(b,c,d,a,W[13],21,0x4e0811a1UL)
    II(a,b,c,d,W[4],6,0xf7537e82UL)
    II(d,a,b,c,W[11],10,0xbd3af235UL)
    II(c,d,a,b,W[2],15,0x2ad7d2bbUL)
    II(b,c,d,a,W[9],21,0xeb86d391UL)
#endif

    md->md5.state[0] = md->md5.state[0] + a;
    md->md5.state[1] = md->md5.state[1] + b;
    md->md5.state[2] = md->md5.state[2] + c;
    md->md5.state[3] = md->md5.state[3] + d;

    return CRYPT_OK;
}